

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

void __thiscall cfd::core::Pubkey::Pubkey(Pubkey *this,ByteData *byte_data)

{
  bool bVar1;
  CfdException *this_00;
  string sStack_58;
  CfdSourceLocation local_38;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&byte_data->data_);
  bVar1 = IsValid(&this->data_);
  if (bVar1) {
    return;
  }
  local_38.filename = "cfdcore_key.cpp";
  local_38.line = 0x2d;
  local_38.funcname = "Pubkey";
  ByteData::GetHex_abi_cxx11_(&sStack_58,&this->data_);
  logger::warn<std::__cxx11::string>(&local_38,"Invalid Pubkey data. hex={}.",&sStack_58);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&sStack_58,"Invalid Pubkey data.",(allocator *)&local_38)
  ;
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&sStack_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey::Pubkey(ByteData byte_data) : data_(byte_data) {
  if (!Pubkey::IsValid(data_)) {
    warn(CFD_LOG_SOURCE, "Invalid Pubkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey data.");
  }
}